

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::UpdateBean::
act<hiberlite::AVisitor<hiberlite::UpdateBean>,int,hiberlite::stl_stream_adapter<int,std::vector<int,std::allocator<int>>>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av,
          collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
          *nvp)

{
  pointer piVar1;
  AVisitor<hiberlite::UpdateBean> *pAVar2;
  UpdateBean *this_00;
  sqlid_t rowid;
  RowScope *pRVar3;
  string tab;
  sql_nvp<int> el_nvp;
  allocator local_1ca;
  allocator local_1c9;
  AVisitor<hiberlite::UpdateBean> *local_1c8;
  long local_1c0;
  UpdateBean *local_1b8;
  shared_connection local_1b0;
  collection_nvp<int,_hiberlite::stl_stream_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  *local_1a0;
  int *local_198;
  shared_res<hiberlite::autoclosed_con> local_190;
  string local_180 [32];
  string local_160;
  string local_140;
  Scope local_120;
  string local_d8;
  string local_b8;
  string local_98;
  sql_nvp<int> local_78;
  
  std::__cxx11::string::string((string *)&local_140,(string *)nvp);
  AVisitor<hiberlite::UpdateBean>::diveTable(av,&local_140);
  local_1b8 = this;
  std::__cxx11::string::~string((string *)&local_140);
  local_1c8 = av;
  Scope::Scope(&local_120,&av->scope);
  std::__cxx11::string::string(local_180,(string *)&local_120);
  Scope::~Scope(&local_120);
  local_198 = &(nvp->stream).xx;
  local_1c0 = 0;
  local_1a0 = nvp;
  while( true ) {
    piVar1 = (local_1a0->stream).it._M_current;
    if (piVar1 == (((local_1a0->stream).ct)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) break;
    (local_1a0->stream).it._M_current = piVar1 + 1;
    (local_1a0->stream).xx = *piVar1;
    local_1b0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_1b0.res = (local_1c8->rootKey).con.res;
    if (local_1b0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_1b0.res)->refCount = (local_1b0.res)->refCount + 1;
    }
    std::__cxx11::string::string((string *)&local_160,local_180);
    rowid = Database::allocId(&local_1b0,&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1b0);
    std::__cxx11::string::string((string *)&local_98,local_180);
    this_00 = local_1b8;
    pRVar3 = curRow(local_1b8);
    startRow(this_00,&local_98,rowid,pRVar3->id,local_1c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_b8,"item",&local_1c9);
    std::__cxx11::string::string((string *)&local_d8,"",&local_1ca);
    sql_nvp<int>::sql_nvp((sql_nvp<int> *)&local_120,&local_b8,local_198,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    sql_nvp<int>::sql_nvp(&local_78,(sql_nvp<int> *)&local_120);
    pAVar2 = local_1c8;
    AVisitor<hiberlite::UpdateBean>::operator&(local_1c8,&local_78);
    sql_nvp<int>::~sql_nvp(&local_78);
    local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_190.res = (pAVar2->rootKey).con.res;
    if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_190.res)->refCount = (local_190.res)->refCount + 1;
    }
    commitRow(local_1b8,&local_190,rowid);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_190);
    local_1c0 = local_1c0 + 1;
    sql_nvp<int>::~sql_nvp((sql_nvp<int> *)&local_120);
  }
  AVisitor<hiberlite::UpdateBean>::popScope(local_1c8);
  std::__cxx11::string::~string(local_180);
  return;
}

Assistant:

void UpdateBean::act(AV& av, collection_nvp<E,S> nvp ){

	sqlid_t index=0;
	S& stream=nvp.stream;

	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		while(!stream.done()){
			E& el=stream.getNext();
				sqlid_t entry_id=Database::allocId(av.getConnection(), tab);

				startRow(tab,entry_id, curRow()->id,index);
					sql_nvp<E> el_nvp("item",el);
					av & el_nvp;
				commitRow(av.getConnection(), entry_id);
			index++;
		}
	av.pop();
}